

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall httplib::detail::stream_line_reader::append(stream_line_reader *this,char c)

{
  size_t sVar1;
  ulong uVar2;
  char c_local;
  stream_line_reader *this_local;
  
  if (this->fixed_buffer_used_size_ < this->fixed_buffer_size_ - 1) {
    sVar1 = this->fixed_buffer_used_size_;
    this->fixed_buffer_used_size_ = sVar1 + 1;
    this->fixed_buffer_[sVar1] = c;
    this->fixed_buffer_[this->fixed_buffer_used_size_] = '\0';
  }
  else {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      if (this->fixed_buffer_[this->fixed_buffer_used_size_] != '\0') {
        __assert_fail("fixed_buffer_[fixed_buffer_used_size_] == \'\\0\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Ethiraric[P]cpptalksindex/deps/cpp-httplib/httplib.h"
                      ,0x47e,"void httplib::detail::stream_line_reader::append(char)");
      }
      std::__cxx11::string::assign((char *)&this->glowable_buffer_,(ulong)this->fixed_buffer_);
    }
    std::__cxx11::string::operator+=((string *)&this->glowable_buffer_,c);
  }
  return;
}

Assistant:

void append(char c) {
    if (fixed_buffer_used_size_ < fixed_buffer_size_ - 1) {
      fixed_buffer_[fixed_buffer_used_size_++] = c;
      fixed_buffer_[fixed_buffer_used_size_] = '\0';
    } else {
      if (glowable_buffer_.empty()) {
        assert(fixed_buffer_[fixed_buffer_used_size_] == '\0');
        glowable_buffer_.assign(fixed_buffer_, fixed_buffer_used_size_);
      }
      glowable_buffer_ += c;
    }
  }